

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

int xmlNodeDump(xmlBufferPtr buf,xmlDocPtr doc,xmlNodePtr cur,int level,int format)

{
  xmlBufPtr buf_00;
  size_t sVar1;
  int iVar2;
  
  iVar2 = -1;
  if (cur != (xmlNodePtr)0x0 && buf != (xmlBufferPtr)0x0) {
    buf_00 = xmlBufFromBuffer(buf);
    if (buf_00 != (xmlBufPtr)0x0) {
      sVar1 = xmlBufNodeDump(buf_00,doc,cur,level,format);
      xmlBufBackToBuffer(buf_00);
      iVar2 = -1;
      if (sVar1 < 0x80000000) {
        iVar2 = (int)sVar1;
      }
    }
  }
  return iVar2;
}

Assistant:

int
xmlNodeDump(xmlBufferPtr buf, xmlDocPtr doc, xmlNodePtr cur, int level,
            int format)
{
    xmlBufPtr buffer;
    size_t ret;

    if ((buf == NULL) || (cur == NULL))
        return(-1);
    buffer = xmlBufFromBuffer(buf);
    if (buffer == NULL)
        return(-1);
    ret = xmlBufNodeDump(buffer, doc, cur, level, format);
    xmlBufBackToBuffer(buffer);
    if (ret > INT_MAX)
        return(-1);
    return(ret);
}